

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

void __thiscall Shader::compile(Shader *this,char *vert_src,char *frag_src,char *geom_src)

{
  uint32_t uVar1;
  uint32_t uVar2;
  GLuint GVar3;
  tm *ptVar4;
  ostream *poVar5;
  GLuint local_44;
  GLuint sh_geom;
  GLuint sh_frag;
  GLuint sh_vert;
  tm *ptm;
  time_t rawtime;
  char *geom_src_local;
  char *frag_src_local;
  char *vert_src_local;
  Shader *this_local;
  
  rawtime = (time_t)geom_src;
  geom_src_local = frag_src;
  frag_src_local = vert_src;
  vert_src_local = (char *)this;
  ptm = (tm *)time((time_t *)0x0);
  ptVar4 = localtime((time_t *)&ptm);
  sprintf(ta,"[%02d:%02d:%02d]: ",(ulong)(uint)ptVar4->tm_hour,(ulong)(uint)ptVar4->tm_min,
          (ulong)(uint)ptVar4->tm_sec);
  poVar5 = std::operator<<((ostream *)&std::cerr,ta);
  poVar5 = std::operator<<(poVar5,"Compiling sources: ");
  poVar5 = std::operator<<(poVar5,frag_src_local);
  poVar5 = std::operator<<(poVar5,' ');
  poVar5 = std::operator<<(poVar5,geom_src_local);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)logFile,ta);
  poVar5 = std::operator<<(poVar5,"Compiling sources: ");
  poVar5 = std::operator<<(poVar5,frag_src_local);
  poVar5 = std::operator<<(poVar5,' ');
  poVar5 = std::operator<<(poVar5,geom_src_local);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  uVar1 = create_shader(this,frag_src_local,0x8b31);
  uVar2 = create_shader(this,geom_src_local,0x8b30);
  if (rawtime != 0) {
    local_44 = create_shader(this,(char *)rawtime,0x8dd9);
  }
  GVar3 = (*glad_glCreateProgram)();
  this->m_id = GVar3;
  (*glad_glAttachShader)(this->m_id,uVar1);
  (*glad_glAttachShader)(this->m_id,uVar2);
  if (rawtime != 0) {
    (*glad_glAttachShader)(this->m_id,local_44);
  }
  (*glad_glLinkProgram)(this->m_id);
  check_errors(this,this->m_id,2);
  (*glad_glDeleteShader)(uVar1);
  (*glad_glDeleteShader)(uVar2);
  if (rawtime != 0) {
    (*glad_glDeleteShader)(local_44);
  }
  (*glad_glDetachShader)(this->m_id,uVar1);
  (*glad_glDetachShader)(this->m_id,uVar2);
  if (rawtime != 0) {
    (*glad_glDetachShader)(this->m_id,local_44);
  }
  return;
}

Assistant:

void Shader::compile(const char *vert_src, const char *frag_src, const char *geom_src)
{
    LOG_INFO("Compiling sources: " << vert_src << ' ' << frag_src);
    GLuint sh_vert, sh_frag, sh_geom;

    // Vertex shader
    sh_vert = create_shader(vert_src, GL_VERTEX_SHADER);
    // Fragment shader
    sh_frag = create_shader(frag_src, GL_FRAGMENT_SHADER);
    // Geometry shader
    if (geom_src != nullptr)
        sh_geom = create_shader(geom_src, GL_GEOMETRY_SHADER);
    
    // Create program
    m_id = glCreateProgram();

    // Attach shaders
    glAttachShader(m_id, sh_vert);
    glAttachShader(m_id, sh_frag);
    if (geom_src != nullptr)
        glAttachShader(m_id, sh_geom);

    // Link the program and check for any link errors
    glLinkProgram(m_id);
    check_errors(m_id, LINK_ERRORS);

    // Clean up after linked, no longer needed
    glDeleteShader(sh_vert);
    glDeleteShader(sh_frag);
    if (geom_src != nullptr)
        glDeleteShader(sh_geom);

    glDetachShader(m_id, sh_vert);
    glDetachShader(m_id, sh_frag);
    if (geom_src != nullptr)
        glDetachShader(m_id, sh_geom);
}